

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

void __thiscall Imf_3_2::RgbaOutputFile::ToYca::decimateChromaVertAndWriteScanLine(ToYca *this)

{
  if ((this->_linesConverted & 1) == 0) {
    RgbaYca::decimateChromaVert(this->_width,this->_buf,this->_tmpBuf);
  }
  else {
    memcpy(this->_tmpBuf,this->_buf[0xd],(long)this->_width << 3);
  }
  if ((this->_writeY == true) && (this->_writeC == true)) {
    RgbaYca::roundYCA(this->_width,this->_roundY,this->_roundC,this->_tmpBuf,this->_tmpBuf);
  }
  OutputFile::writePixels(this->_outputFile,1);
  return;
}

Assistant:

void
RgbaOutputFile::ToYca::decimateChromaVertAndWriteScanLine ()
{
    if (_linesConverted & 1)
        memcpy (_tmpBuf, _buf[N2], _width * sizeof (Rgba));
    else
        decimateChromaVert (_width, _buf, _tmpBuf);

    if (_writeY && _writeC)
        roundYCA (_width, _roundY, _roundC, _tmpBuf, _tmpBuf);

    _outputFile.writePixels (1);
}